

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O1

int lrtr_ip_str_to_addr(char *str,lrtr_ip_addr *ip)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = strchr(str,0x3a);
  if (pcVar3 == (char *)0x0) {
    ip->ver = LRTR_IPV4;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      iVar2 = lrtr_ipv4_str_to_addr(str,&(ip->u).addr4);
      return iVar2;
    }
  }
  else {
    ip->ver = LRTR_IPV6;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      iVar2 = lrtr_ipv6_str_to_addr(str,&(ip->u).addr6);
      return iVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int lrtr_ip_str_to_addr(const char *str, struct lrtr_ip_addr *ip)
{
	if (!strchr(str, ':')) {
		ip->ver = LRTR_IPV4;
		return lrtr_ipv4_str_to_addr(str, &(ip->u.addr4));
	}
	ip->ver = LRTR_IPV6;
	return lrtr_ipv6_str_to_addr(str, &(ip->u.addr6));
}